

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_double<long_double>
          (BasicWriter<char> *this,longdouble value,FormatSpec *spec)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Alignment AVar4;
  wchar_t wVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  CharPtr p_00;
  char *pcVar9;
  char *pcVar10;
  CharPtr pcVar11;
  FormatSpec *in_RSI;
  BasicWriter<char> *in_RDI;
  longdouble in_stack_00000008;
  CharPtr p;
  int result;
  size_t buffer_size;
  char *start;
  uint n;
  char fill;
  uint width_for_sprintf;
  char *format_ptr;
  char format [10];
  uint width;
  size_t offset;
  CharPtr out_1;
  char *inf;
  size_t inf_size;
  CharPtr out;
  char *nan;
  size_t nan_size;
  char sign;
  bool upper;
  char type;
  undefined2 uVar12;
  undefined6 in_stack_fffffffffffffed2;
  double in_stack_fffffffffffffed8;
  BasicWriter<char> *in_stack_fffffffffffffee0;
  undefined2 in_stack_fffffffffffffee8;
  wchar_t in_stack_fffffffffffffeec;
  ulong in_stack_fffffffffffffef0;
  AlignSpec *in_stack_fffffffffffffef8;
  uint total_size;
  size_t in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  char *local_d8;
  char *local_d0;
  char local_c1;
  undefined4 in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  char *local_90;
  uint local_84;
  char *local_78;
  char local_6e;
  char local_6d [9];
  uint local_64;
  size_t local_60;
  char *local_50;
  undefined8 local_48;
  char *local_38;
  undefined8 local_30;
  char local_23;
  byte local_22;
  char local_21;
  FormatSpec *local_20;
  longdouble local_18;
  
  cVar2 = (char)((ulong)in_stack_ffffffffffffff50 >> 0x38);
  local_18 = in_stack_00000008;
  local_20 = in_RSI;
  local_21 = FormatSpec::type(in_RSI);
  local_22 = 0;
  iVar3 = (int)local_21;
  if (local_21 == '\0') {
    local_21 = 'g';
  }
  else if ((iVar3 == 0x41) || (iVar3 - 0x45U < 3)) {
    local_22 = 1;
  }
  else if ((iVar3 != 0x61) && (2 < iVar3 - 0x65U)) {
    internal::report_unknown_type(cVar2,(char *)CONCAT44(iVar3,in_stack_ffffffffffffff48));
  }
  local_23 = '\0';
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnegative(in_stack_fffffffffffffed8);
  if (bVar1) {
    local_23 = '-';
    local_18 = -local_18;
  }
  else {
    bVar1 = FormatSpec::flag(local_20,1);
    if (bVar1) {
      bVar1 = FormatSpec::flag(local_20,2);
      local_c1 = '+';
      if (!bVar1) {
        local_c1 = ' ';
      }
      local_23 = local_c1;
    }
  }
  bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isnotanumber<long_double>
                    ((longdouble)CONCAT28(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0));
  if (bVar1) {
    local_30 = 4;
    if ((local_22 & 1) == 0) {
      local_d0 = " nan";
    }
    else {
      local_d0 = " NAN";
    }
    local_38 = local_d0;
    if (local_23 == '\0') {
      local_30 = 3;
      local_38 = local_d0 + 1;
    }
    pcVar11 = write_str<char>((BasicWriter<char> *)
                              CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                              in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                              in_stack_fffffffffffffef8);
    if (local_23 != '\0') {
      *pcVar11 = local_23;
    }
  }
  else {
    sVar7 = SUB108(local_18,0);
    uVar12 = (undefined2)((unkuint10)local_18 >> 0x40);
    bVar1 = std::numeric_limits<fmt::internal::DummyInt>::isinfinity<long_double>
                      ((longdouble)CONCAT28(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0));
    if (bVar1) {
      local_48 = 4;
      if ((local_22 & 1) == 0) {
        local_d8 = " inf";
      }
      else {
        local_d8 = " INF";
      }
      local_50 = local_d8;
      if (local_23 == '\0') {
        local_48 = 3;
        local_50 = local_d8 + 1;
      }
      pcVar11 = write_str<char>((BasicWriter<char> *)
                                CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                                in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                                in_stack_fffffffffffffef8);
      if (local_23 != '\0') {
        *pcVar11 = local_23;
      }
    }
    else {
      local_60 = Buffer<char>::size(in_RDI->buffer_);
      local_64 = WidthSpec::width((WidthSpec *)local_20);
      if (local_23 != '\0') {
        Buffer<char>::size(in_RDI->buffer_);
        Buffer<char>::reserve((Buffer<char> *)CONCAT62(in_stack_fffffffffffffed2,uVar12),sVar7);
        if (local_64 != 0) {
          local_64 = local_64 - 1;
        }
        local_60 = local_60 + 1;
      }
      local_78 = local_6d;
      local_6e = '%';
      bVar1 = FormatSpec::flag(local_20,8);
      if (bVar1) {
        pcVar10 = local_78 + 1;
        *local_78 = '#';
        local_78 = pcVar10;
      }
      AVar4 = AlignSpec::align(&local_20->super_AlignSpec);
      if (AVar4 != ALIGN_CENTER) {
        AVar4 = AlignSpec::align(&local_20->super_AlignSpec);
        if (AVar4 == ALIGN_LEFT) {
          *local_78 = '-';
          local_78 = local_78 + 1;
        }
        if (local_64 != 0) {
          *local_78 = '*';
          local_78 = local_78 + 1;
        }
      }
      iVar3 = FormatSpec::precision(local_20);
      if (-1 < iVar3) {
        pcVar10 = local_78 + 1;
        *local_78 = '.';
        local_78 = local_78 + 2;
        *pcVar10 = '*';
      }
      append_float_length(in_RDI,&local_78,local_18);
      *local_78 = local_21;
      local_78[1] = '\0';
      local_78 = local_78 + 1;
      wVar5 = WidthSpec::fill((WidthSpec *)local_20);
      cVar2 = internal::BasicCharTraits<char>::cast(wVar5);
      while( true ) {
        while( true ) {
          sVar7 = Buffer<char>::capacity(in_RDI->buffer_);
          pcVar11 = (CharPtr)(sVar7 - local_60);
          local_90 = Buffer<char>::operator[](in_RDI->buffer_,local_60);
          pcVar10 = &local_6e;
          pcVar9 = local_90;
          FormatSpec::precision(local_20);
          sVar7 = SUB108(local_18,0);
          uVar12 = (undefined2)((unkuint10)local_18 >> 0x40);
          iVar3 = internal::CharTraits<char>::format_float<long_double>
                            (pcVar10,(size_t)pcVar11,pcVar9,
                             (uint)(in_stack_fffffffffffffef0 >> 0x20),
                             (int)in_stack_fffffffffffffef0,
                             (longdouble)
                             CONCAT28(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0));
          total_size = (uint)((ulong)pcVar9 >> 0x20);
          if (-1 < iVar3) break;
          in_stack_fffffffffffffee8 = SUB82(in_RDI->buffer_,0);
          in_stack_fffffffffffffeec = (wchar_t)((ulong)in_RDI->buffer_ >> 0x20);
          Buffer<char>::capacity(in_RDI->buffer_);
          Buffer<char>::reserve((Buffer<char> *)CONCAT62(in_stack_fffffffffffffed2,uVar12),sVar7);
        }
        local_84 = internal::to_unsigned<int>(iVar3);
        in_stack_fffffffffffffef0 = local_60 + local_84;
        sVar8 = Buffer<char>::capacity(in_RDI->buffer_);
        if (in_stack_fffffffffffffef0 < sVar8) break;
        Buffer<char>::reserve((Buffer<char> *)CONCAT62(in_stack_fffffffffffffed2,uVar12),sVar7);
      }
      if (local_23 != '\0') {
        AVar4 = AlignSpec::align(&local_20->super_AlignSpec);
        if (((AVar4 == ALIGN_RIGHT) ||
            (AVar4 = AlignSpec::align(&local_20->super_AlignSpec), AVar4 == ALIGN_DEFAULT)) &&
           (*local_90 == ' ')) {
          local_90[-1] = cVar2;
        }
        else {
          local_90[-1] = local_23;
          local_23 = '\0';
        }
        local_84 = local_84 + 1;
      }
      AVar4 = AlignSpec::align(&local_20->super_AlignSpec);
      if ((AVar4 == ALIGN_CENTER) &&
         (uVar6 = WidthSpec::width((WidthSpec *)local_20), local_84 < uVar6)) {
        local_64 = WidthSpec::width((WidthSpec *)local_20);
        p_00 = grow_buffer(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
        pcVar10 = get(p_00);
        pcVar10 = pcVar10 + (local_64 - local_84 >> 1);
        pcVar9 = get(p_00);
        memmove(pcVar10,pcVar9,(ulong)local_84);
        WidthSpec::width((WidthSpec *)local_20);
        fill_padding(pcVar11,total_size,in_stack_fffffffffffffef0,in_stack_fffffffffffffeec);
      }
      else {
        wVar5 = WidthSpec::fill((WidthSpec *)local_20);
        if ((wVar5 != L' ') || (local_23 != '\0')) {
          while (*local_90 == ' ') {
            *local_90 = cVar2;
            local_90 = local_90 + 1;
          }
          if (local_23 != '\0') {
            local_90[-1] = local_23;
          }
        }
        grow_buffer(in_stack_fffffffffffffee0,(size_t)in_stack_fffffffffffffed8);
      }
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_double(T value, const FormatSpec &spec) {
  // Check type.
  char type = spec.type();
  bool upper = false;
  switch (type) {
  case 0:
    type = 'g';
    break;
  case 'e': case 'f': case 'g': case 'a':
    break;
  case 'F':
#if FMT_MSC_VER
    // MSVC's printf doesn't support 'F'.
    type = 'f';
#endif
    // Fall through.
  case 'E': case 'G': case 'A':
    upper = true;
    break;
  default:
    internal::report_unknown_type(type, "double");
    break;
  }

  char sign = 0;
  // Use isnegative instead of value < 0 because the latter is always
  // false for NaN.
  if (internal::FPUtil::isnegative(static_cast<double>(value))) {
    sign = '-';
    value = -value;
  } else if (spec.flag(SIGN_FLAG)) {
    sign = spec.flag(PLUS_FLAG) ? '+' : ' ';
  }

  if (internal::FPUtil::isnotanumber(value)) {
    // Format NaN ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t nan_size = 4;
    const char *nan = upper ? " NAN" : " nan";
    if (!sign) {
      --nan_size;
      ++nan;
    }
    CharPtr out = write_str(nan, nan_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  if (internal::FPUtil::isinfinity(value)) {
    // Format infinity ourselves because sprintf's output is not consistent
    // across platforms.
    std::size_t inf_size = 4;
    const char *inf = upper ? " INF" : " inf";
    if (!sign) {
      --inf_size;
      ++inf;
    }
    CharPtr out = write_str(inf, inf_size, spec);
    if (sign)
      *out = sign;
    return;
  }

  std::size_t offset = buffer_.size();
  unsigned width = spec.width();
  if (sign) {
    buffer_.reserve(buffer_.size() + (width > 1u ? width : 1u));
    if (width > 0)
      --width;
    ++offset;
  }

  // Build format string.
  enum { MAX_FORMAT_SIZE = 10}; // longest format: %#-*.*Lg
  Char format[MAX_FORMAT_SIZE];
  Char *format_ptr = format;
  *format_ptr++ = '%';
  unsigned width_for_sprintf = width;
  if (spec.flag(HASH_FLAG))
    *format_ptr++ = '#';
  if (spec.align() == ALIGN_CENTER) {
    width_for_sprintf = 0;
  } else {
    if (spec.align() == ALIGN_LEFT)
      *format_ptr++ = '-';
    if (width != 0)
      *format_ptr++ = '*';
  }
  if (spec.precision() >= 0) {
    *format_ptr++ = '.';
    *format_ptr++ = '*';
  }

  append_float_length(format_ptr, value);
  *format_ptr++ = type;
  *format_ptr = '\0';

  // Format using snprintf.
  Char fill = internal::CharTraits<Char>::cast(spec.fill());
  unsigned n = 0;
  Char *start = 0;
  for (;;) {
    std::size_t buffer_size = buffer_.capacity() - offset;
#if FMT_MSC_VER
    // MSVC's vsnprintf_s doesn't work with zero size, so reserve
    // space for at least one extra character to make the size non-zero.
    // Note that the buffer's capacity will increase by more than 1.
    if (buffer_size == 0) {
      buffer_.reserve(offset + 1);
      buffer_size = buffer_.capacity() - offset;
    }
#endif
    start = &buffer_[offset];
    int result = internal::CharTraits<Char>::format_float(
        start, buffer_size, format, width_for_sprintf, spec.precision(), value);
    if (result >= 0) {
      n = internal::to_unsigned(result);
      if (offset + n < buffer_.capacity())
        break;  // The buffer is large enough - continue with formatting.
      buffer_.reserve(offset + n + 1);
    } else {
      // If result is negative we ask to increase the capacity by at least 1,
      // but as std::vector, the buffer grows exponentially.
      buffer_.reserve(buffer_.capacity() + 1);
    }
  }
  if (sign) {
    if ((spec.align() != ALIGN_RIGHT && spec.align() != ALIGN_DEFAULT) ||
        *start != ' ') {
      *(start - 1) = sign;
      sign = 0;
    } else {
      *(start - 1) = fill;
    }
    ++n;
  }
  if (spec.align() == ALIGN_CENTER && spec.width() > n) {
    width = spec.width();
    CharPtr p = grow_buffer(width);
    std::memmove(get(p) + (width - n) / 2, get(p), n * sizeof(Char));
    fill_padding(p, spec.width(), n, fill);
    return;
  }
  if (spec.fill() != ' ' || sign) {
    while (*start == ' ')
      *start++ = fill;
    if (sign)
      *(start - 1) = sign;
  }
  grow_buffer(n);
}